

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

string * flatbuffers::SwiftGRPCGenerator::GeneratedFileName
                   (string *__return_storage_ptr__,string *path,string *file_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,path,file_name);
  std::operator+(__return_storage_ptr__,&local_30,".grpc.swift");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string GeneratedFileName(const std::string &path,
                                       const std::string &file_name) {
    return path + file_name + ".grpc.swift";
  }